

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

Literal * __thiscall
wasm::Literal::dotSI8x16toI16x8(Literal *__return_storage_ptr__,Literal *this,Literal *other)

{
  Type TVar1;
  bool bVar2;
  ulong uVar3;
  Literal *val;
  bool bVar4;
  long lVar5;
  Type *this_00;
  undefined1 local_410 [8];
  LaneArray<8UL_*_2UL> lhs;
  LaneArray<8UL_*_2UL> rhs;
  LaneArray<8UL> result;
  anon_union_16_5_9943fe1e_for_Literal_0 local_48;
  undefined8 local_38;
  
  result._M_elems[7].type.id = (uintptr_t)__return_storage_ptr__;
  getLanes<signed_char,16>((LaneArray<16> *)local_410,(wasm *)this,other);
  getLanes<signed_char,16>((LaneArray<16> *)&lhs._M_elems[0xf].type,(wasm *)other,val);
  lVar5 = 0;
  memset(&rhs._M_elems[0xf].type,0,0xc0);
  do {
    local_48.i32 = 0;
    local_38 = 2;
    this_00 = &result._M_elems[lVar5 + -1].type;
    if ((anon_union_16_5_9943fe1e_for_Literal_0 *)this_00 != &local_48) {
      ~Literal((Literal *)this_00);
      Literal((Literal *)this_00,(Literal *)&local_48.func);
    }
    ~Literal((Literal *)&local_48.func);
    uVar3 = 0;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      if (((result._M_elems[lVar5].field_0.func.super_IString.str._M_str != (char *)0x2) ||
          (uVar3 = uVar3 | lVar5 * 2,
          lhs._M_elems[uVar3].field_0.func.super_IString.str._M_str != (char *)0x2)) ||
         (rhs._M_elems[uVar3].field_0.func.super_IString.str._M_str != (char *)0x2)) {
        __assert_fail("type == Type::i32",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/literal.h"
                      ,0x118,"int32_t wasm::Literal::geti32() const");
      }
      local_48.i32 = (int)rhs._M_elems[uVar3 - 1].type.id * (int)lhs._M_elems[uVar3 - 1].type.id +
                     (int)this_00->id;
      local_38 = 2;
      if ((anon_union_16_5_9943fe1e_for_Literal_0 *)this_00 != &local_48) {
        ~Literal((Literal *)this_00);
        Literal((Literal *)this_00,(Literal *)&local_48.func);
      }
      ~Literal((Literal *)&local_48.func);
      TVar1 = result._M_elems[7].type;
      uVar3 = 1;
      bVar2 = false;
    } while (bVar4);
    lVar5 = lVar5 + 1;
    if (lVar5 == 8) {
      Literal((Literal *)result._M_elems[7].type.id,(LaneArray<8> *)&rhs._M_elems[0xf].type);
      lVar5 = 0xa8;
      do {
        ~Literal((Literal *)((long)result._M_elems + lVar5 + -8));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      lVar5 = 0x168;
      do {
        ~Literal((Literal *)((long)rhs._M_elems + lVar5 + -8));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      lVar5 = 0x168;
      do {
        ~Literal((Literal *)(local_410 + lVar5));
        lVar5 = lVar5 + -0x18;
      } while (lVar5 != -0x18);
      return (Literal *)TVar1.id;
    }
  } while( true );
}

Assistant:

Literal Literal::dotSI8x16toI16x8(const Literal& other) const {
  return dot<8, 2, &Literal::getLanesSI8x16>(*this, other);
}